

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationBasicCase::genShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  _anonymous_namespace_ *this_00;
  ostream *poVar1;
  Context *context;
  void *pvVar2;
  char *code;
  char *pcVar3;
  bool local_1e9;
  string local_1e8 [32];
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream buf;
  bool useImageAtomics;
  InvocationBasicCase *this_local;
  
  local_1e9 = false;
  if ((*(byte *)((long)this + 0x7c) & 1) != 0) {
    local_1e9 = *(int *)((long)this + 0x78) == 1;
  }
  pvVar2 = this;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"${GLSL_VERSION_DECL}\n");
  code = (char *)CONCAT71((int7)((ulong)pvVar2 >> 8),local_1e9);
  pcVar3 = "";
  if (local_1e9 != false) {
    pcVar3 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"layout (local_size_x=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x88));
  poVar1 = std::operator<<(poVar1,", local_size_y=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x8c));
  poVar1 = std::operator<<(poVar1,") in;\n");
  poVar1 = std::operator<<(poVar1,"layout(binding=0, std430) buffer Output\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\thighp int values[];\n");
  std::operator<<(poVar1,"} sb_result;\n");
  if (*(int *)((long)this + 0x78) == 0) {
    poVar1 = std::operator<<((ostream *)local_198,
                             "layout(binding=1, std430) coherent buffer Storage\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"\thighp int values[];\n");
    poVar1 = std::operator<<(poVar1,"} sb_store;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,
                             "highp int getIndex (in highp uvec2 localID, in highp int element)\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,
                             "\thighp uint groupNdx = gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                            );
    poVar1 = std::operator<<(poVar1,
                             "\treturn int((localID.y * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x) + (groupNdx * gl_WorkGroupSize.x) + localID.x) * "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x90));
    poVar1 = std::operator<<(poVar1," + element;\n");
    std::operator<<(poVar1,"}\n");
  }
  else if (*(int *)((long)this + 0x78) == 1) {
    poVar1 = std::operator<<((ostream *)local_198,
                             "layout(r32i, binding=1) coherent uniform highp iimage2D u_image;\n");
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,
                             "highp ivec2 getCoord (in highp uvec2 localID, in highp int element)\n"
                            );
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,
                             "\treturn ivec2(int(gl_WorkGroupID.x * gl_WorkGroupSize.x + localID.x), int(gl_WorkGroupID.y * gl_WorkGroupSize.y + localID.y) + element * "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)this + 0x84));
    poVar1 = std::operator<<(poVar1,");\n");
    std::operator<<(poVar1,"}\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,
                           "\tint resultNdx   = int(gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x + gl_GlobalInvocationID.x);\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "\tint groupNdx    = int(gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x);\n"
                          );
  poVar1 = std::operator<<(poVar1,"\tbool allOk      = true;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  (**(code **)(*this + 0x30))(local_1c8);
  poVar1 = std::operator<<(poVar1,local_1c8);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tsb_result.values[resultNdx] = (allOk) ? (1) : (0);\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::~string(local_1c8);
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::ostringstream::str();
  context = (Context *)std::__cxx11::string::c_str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,context,code);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InvocationBasicCase::genShaderSource (void) const
{
	const bool			useImageAtomics = m_useAtomic && m_storage == STORAGE_IMAGE;
	std::ostringstream	buf;

	buf << "${GLSL_VERSION_DECL}\n"
		<< ((useImageAtomics) ? ("${SHADER_IMAGE_ATOMIC_REQUIRE}\n") : (""))
		<< "layout (local_size_x=" << m_localWidth << ", local_size_y=" << m_localHeight << ") in;\n"
		<< "layout(binding=0, std430) buffer Output\n"
		<< "{\n"
		<< "	highp int values[];\n"
		<< "} sb_result;\n";

	if (m_storage == STORAGE_BUFFER)
		buf << "layout(binding=1, std430) coherent buffer Storage\n"
			<< "{\n"
			<< "	highp int values[];\n"
			<< "} sb_store;\n"
			<< "\n"
			<< "highp int getIndex (in highp uvec2 localID, in highp int element)\n"
			<< "{\n"
			<< "	highp uint groupNdx = gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "	return int((localID.y * gl_NumWorkGroups.x * gl_NumWorkGroups.y * gl_WorkGroupSize.x) + (groupNdx * gl_WorkGroupSize.x) + localID.x) * " << m_elementsPerInvocation << " + element;\n"
			<< "}\n";
	else if (m_storage == STORAGE_IMAGE)
		buf << "layout(r32i, binding=1) coherent uniform highp iimage2D u_image;\n"
			<< "\n"
			<< "highp ivec2 getCoord (in highp uvec2 localID, in highp int element)\n"
			<< "{\n"
			<< "	return ivec2(int(gl_WorkGroupID.x * gl_WorkGroupSize.x + localID.x), int(gl_WorkGroupID.y * gl_WorkGroupSize.y + localID.y) + element * " << m_workHeight << ");\n"
			<< "}\n";
	else
		DE_ASSERT(DE_FALSE);

	buf << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	int resultNdx   = int(gl_GlobalInvocationID.y * gl_NumWorkGroups.x * gl_WorkGroupSize.x + gl_GlobalInvocationID.x);\n"
		<< "	int groupNdx    = int(gl_NumWorkGroups.x * gl_WorkGroupID.y + gl_WorkGroupID.x);\n"
		<< "	bool allOk      = true;\n"
		<< "\n"
		<< genShaderMainBlock()
		<< "\n"
		<< "	sb_result.values[resultNdx] = (allOk) ? (1) : (0);\n"
		<< "}\n";

	return specializeShader(m_context, buf.str().c_str());
}